

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O2

string * __thiscall
flatbuffers::(anonymous_namespace)::ToValueString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryRegion *region,
          uint8_t *binary,OutputConfig *output_config)

{
  float fVar1;
  double dVar2;
  char cVar3;
  byte bVar4;
  short sVar5;
  int iVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar8;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  byte *pbVar9;
  uint64_t i;
  ulong uVar10;
  long lVar11;
  string s;
  string local_1d8 [32];
  stringstream ss;
  undefined1 local_1a8 [376];
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  uVar7 = *(ulong *)(this + 0x18);
  iVar6 = *(int *)(this + 0x10);
  if (uVar7 != 0) {
    if (iVar6 != 7) {
      if (iVar6 == 6) {
        lVar11 = (long)&region->offset + *(long *)this;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,lVar11,uVar7 + lVar11);
        goto LAB_00237148;
      }
      if (iVar6 != 0) goto code_r0x00236d07;
    }
    for (uVar10 = 0; uVar10 < uVar7; uVar10 = uVar10 + 1) {
      isprint((uint)*(byte *)((long)&region->offset + uVar10 + *(long *)this));
      std::__cxx11::string::push_back((char)&s);
      uVar7 = *(ulong *)(this + 0x18);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    goto LAB_00237115;
  }
code_r0x00236d07:
  switch(iVar6) {
  case 1:
    anon_unknown_7::ToValueString<unsigned_int>
              ((string *)&ss,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::append((string *)&s);
    goto LAB_002370ae;
  case 2:
    anon_unknown_7::ToValueString<int>((string *)&ss,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::append((string *)&s);
    goto LAB_002370ae;
  case 3:
    anon_unknown_7::ToValueString<unsigned_short>
              ((string *)&ss,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::append((string *)&s);
    goto LAB_002370ae;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar7 = *(ulong *)(this + 8);
    bVar4 = *(byte *)((long)&region->offset + *(long *)this);
    pbVar9 = (byte *)((long)&region->offset + *(long *)this + uVar7);
    uVar8 = extraout_RDX_07;
    for (uVar10 = 0; pbVar9 = pbVar9 + -1, uVar10 < uVar7; uVar10 = uVar10 + 1) {
      ToHex_abi_cxx11_((string *)&ss,(flatbuffers *)(ulong)*pbVar9,(uint8_t)uVar8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ss);
      uVar7 = *(ulong *)(this + 8);
      uVar8 = extraout_RDX_08;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::to_string((string *)&ss,(uint)bVar4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 5:
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar7 = *(ulong *)(this + 8);
    cVar3 = *(char *)((long)&region->offset + *(long *)this);
    pbVar9 = (byte *)((long)&region->offset + *(long *)this + uVar7);
    uVar8 = extraout_RDX;
    for (uVar10 = 0; pbVar9 = pbVar9 + -1, uVar10 < uVar7; uVar10 = uVar10 + 1) {
      ToHex_abi_cxx11_((string *)&ss,(flatbuffers *)(ulong)*pbVar9,(uint8_t)uVar8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ss);
      uVar7 = *(ulong *)(this + 8);
      uVar8 = extraout_RDX_00;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::to_string((string *)&ss,(int)cVar3);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar7 = *(ulong *)(this + 8);
    cVar3 = *(char *)((long)&region->offset + *(long *)this);
    pbVar9 = (byte *)((long)&region->offset + *(long *)this + uVar7);
    uVar8 = extraout_RDX_09;
    for (uVar10 = 0; pbVar9 = pbVar9 + -1, uVar10 < uVar7; uVar10 = uVar10 + 1) {
      ToHex_abi_cxx11_((string *)&ss,(flatbuffers *)(ulong)*pbVar9,(uint8_t)uVar8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ss);
      uVar7 = *(ulong *)(this + 8);
      uVar8 = extraout_RDX_10;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::to_string((string *)&ss,(int)cVar3);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 7:
  case 0x11:
    anon_unknown_7::ToValueString<unsigned_char>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 9:
    anon_unknown_7::ToValueString<unsigned_short>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar7 = *(ulong *)(this + 8);
    sVar5 = *(short *)((long)&region->offset + *(long *)this);
    pbVar9 = (byte *)((long)&region->offset + *(long *)this + uVar7);
    uVar8 = extraout_RDX_11;
    for (uVar10 = 0; pbVar9 = pbVar9 + -1, uVar10 < uVar7; uVar10 = uVar10 + 1) {
      ToHex_abi_cxx11_((string *)&ss,(flatbuffers *)(ulong)*pbVar9,(uint8_t)uVar8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ss);
      uVar7 = *(ulong *)(this + 8);
      uVar8 = extraout_RDX_12;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::to_string((string *)&ss,(int)sVar5);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 0xb:
    anon_unknown_7::ToValueString<unsigned_int>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xc:
    anon_unknown_7::ToValueString<int>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xd:
    anon_unknown_7::ToValueString<unsigned_long>
              (__return_storage_ptr__,(BinaryRegion *)this,(uint8_t *)region);
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar7 = *(ulong *)(this + 8);
    lVar11 = *(long *)((long)&region->offset + *(long *)this);
    pbVar9 = (byte *)((long)&region->offset + *(long *)this + uVar7);
    uVar8 = extraout_RDX_03;
    for (uVar10 = 0; pbVar9 = pbVar9 + -1, uVar10 < uVar7; uVar10 = uVar10 + 1) {
      ToHex_abi_cxx11_((string *)&ss,(flatbuffers *)(ulong)*pbVar9,(uint8_t)uVar8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ss);
      uVar7 = *(ulong *)(this + 8);
      uVar8 = extraout_RDX_04;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::to_string((string *)&ss,lVar11);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar7 = *(ulong *)(this + 8);
    fVar1 = *(float *)((long)&region->offset + *(long *)this);
    pbVar9 = (byte *)((long)&region->offset + *(long *)this + uVar7);
    uVar8 = extraout_RDX_05;
    for (uVar10 = 0; pbVar9 = pbVar9 + -1, uVar10 < uVar7; uVar10 = uVar10 + 1) {
      ToHex_abi_cxx11_((string *)&ss,(flatbuffers *)(ulong)*pbVar9,(uint8_t)uVar8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ss);
      uVar7 = *(ulong *)(this + 8);
      uVar8 = extraout_RDX_06;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1a8,fVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 0x10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar7 = *(ulong *)(this + 8);
    dVar2 = *(double *)((long)&region->offset + *(long *)this);
    pbVar9 = (byte *)((long)&region->offset + *(long *)this + uVar7);
    uVar8 = extraout_RDX_01;
    for (uVar10 = 0; pbVar9 = pbVar9 + -1, uVar10 < uVar7; uVar10 = uVar10 + 1) {
      ToHex_abi_cxx11_((string *)&ss,(flatbuffers *)(ulong)*pbVar9,(uint8_t)uVar8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ss);
      uVar7 = *(ulong *)(this + 8);
      uVar8 = extraout_RDX_02;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::_M_insert<double>(dVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 0x12:
    anon_unknown_7::ToValueString<unsigned_long>
              ((string *)&ss,(BinaryRegion *)this,(uint8_t *)region);
    std::__cxx11::string::append((string *)&s);
LAB_002370ae:
    std::__cxx11::string::~string((string *)&ss);
switchD_00236d15_default:
    if ((*(uint *)(this + 0x10) < 0x13) && ((0x40006U >> (*(uint *)(this + 0x10) & 0x1f) & 1) != 0))
    {
      std::__cxx11::string::append((char *)&s);
      ToHex<unsigned_long>((string *)&ss,*(unsigned_long *)(this + 0x20),*(size_t *)(binary + 0x18))
      ;
      std::__cxx11::string::append((string *)&s);
      std::__cxx11::string::~string((string *)&ss);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
LAB_00237115:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)s._M_dataplus._M_p == &s.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = s.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = s._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = s._M_string_length;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    s._M_dataplus._M_p = (pointer)&s.field_2;
    break;
  default:
    goto switchD_00236d15_default;
  }
LAB_00237148:
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToValueString(const BinaryRegion &region,
                                 const uint8_t *binary,
                                 const OutputConfig &output_config) {
  std::string s;

  if (region.array_length) {
    if (region.type == BinaryRegionType::Uint8 ||
        region.type == BinaryRegionType::Unknown) {
      // Interpret each value as a ASCII to aid debugging
      for (uint64_t i = 0; i < region.array_length; ++i) {
        const uint8_t c = *(binary + region.offset + i);
        s += isprint(c) ? static_cast<char>(c & 0x7F) : '.';
      }
      return s;
    } else if (region.type == BinaryRegionType::Char) {
      // string value
      return ToValueString<std::string>(region, binary);
    }
  }

  switch (region.type) {
    case BinaryRegionType::Uint32:
      return ToValueString<uint32_t>(region, binary);
    case BinaryRegionType::Int32: return ToValueString<int32_t>(region, binary);
    case BinaryRegionType::Uint16:
      return ToValueString<uint16_t>(region, binary);
    case BinaryRegionType::Int16: return ToValueString<int16_t>(region, binary);
    case BinaryRegionType::Bool: return ToValueString<bool>(region, binary);
    case BinaryRegionType::Uint8: return ToValueString<uint8_t>(region, binary);
    case BinaryRegionType::Char: return ToValueString<char>(region, binary);
    case BinaryRegionType::Byte:
    case BinaryRegionType::Int8: return ToValueString<int8_t>(region, binary);
    case BinaryRegionType::Int64: return ToValueString<int64_t>(region, binary);
    case BinaryRegionType::Uint64:
      return ToValueString<uint64_t>(region, binary);
    case BinaryRegionType::Double: return ToValueString<double>(region, binary);
    case BinaryRegionType::Float: return ToValueString<float>(region, binary);
    case BinaryRegionType::UType: return ToValueString<uint8_t>(region, binary);

    // Handle Offsets separately, incase they add additional details.
    case BinaryRegionType::UOffset64:
      s += ToValueString<uint64_t>(region, binary);
      break;
    case BinaryRegionType::UOffset:
      s += ToValueString<uint32_t>(region, binary);
      break;
    case BinaryRegionType::SOffset:
      s += ToValueString<int32_t>(region, binary);
      break;
    case BinaryRegionType::VOffset:
      s += ToValueString<uint16_t>(region, binary);
      break;

    default: break;
  }
  // If this is an offset type, include the calculated offset location in the
  // value.
  // TODO(dbaileychess): It might be nicer to put this in the comment field.
  if (IsOffset(region.type)) {
    s += " Loc: 0x";
    s += ToHex(region.points_to_offset, output_config.offset_max_char);
  }
  return s;
}